

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O3

ofstream * operator<<(ofstream *os,SSTableDataEntry *s)

{
  std::ostream::write((char *)os,(long)s);
  std::ostream::write((char *)os,(long)&s->timestamp);
  std::ostream::write((char *)os,(long)&s->key);
  std::ostream::write((char *)os,(long)&s->value_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)os,(s->value)._M_dataplus._M_p,(s->value)._M_string_length);
  return os;
}

Assistant:

std::ofstream &operator<<(std::ofstream &os, const SSTableDataEntry &s) {
    bytes_write(os, &s.delete_flag);
    bytes_write(os, &s.timestamp);
    bytes_write(os, &s.key);
    bytes_write(os, &s.value_length);
    bytes_write(os, &s.value);
    return os;
}